

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O2

void __thiscall pg::FPISolver::runSeq(FPISolver *this)

{
  int i;
  Game *pGVar1;
  uint64_t *puVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  ostream *poVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int v_1;
  uint winner;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  uint64_t uVar15;
  int v;
  long lVar16;
  int p;
  ulong uVar17;
  ulong uVar18;
  _label_vertex local_40;
  
  bitset::resize(&this->distraction,((this->super_Solver).game)->n_vertices);
  pGVar1 = (this->super_Solver).game;
  uVar14 = pGVar1->n_vertices;
  uVar18 = -(ulong)(uVar14 >> 0x3e != 0) | uVar14 * 4;
  piVar5 = (int *)operator_new__(uVar18);
  this->strategy = piVar5;
  piVar5 = (int *)operator_new__(uVar18);
  this->frozen = piVar5;
  uVar17 = 0;
  memset(piVar5,0,uVar14 * 4);
  iVar10 = *(int *)((long)pGVar1->_priority + ((long)((uVar14 << 0x20) + -0x100000000) >> 0x1e));
  lVar16 = (long)iVar10;
  uVar18 = 0xffffffffffffffff;
  if (-2 < lVar16) {
    uVar18 = lVar16 * 4 + 4;
  }
  pvVar6 = operator_new__(uVar18);
  pvVar7 = operator_new__(uVar18);
  bitset::resize(&this->parity,uVar14);
  pGVar1 = (this->super_Solver).game;
  iVar9 = 0;
  for (; (long)uVar17 <= lVar16; uVar17 = uVar17 + 1) {
    piVar5 = pGVar1->_priority;
    lVar12 = (long)iVar9;
    if (uVar17 == (uint)piVar5[lVar12]) {
      lVar11 = 0;
      *(int *)((long)pvVar6 + uVar17 * 4) = iVar9;
      puVar2 = (this->parity)._bits;
      while ((uVar14 = lVar12 + lVar11, (long)uVar14 < pGVar1->n_vertices &&
             (uVar17 == (uint)piVar5[lVar12 + lVar11]))) {
        uVar18 = uVar14 >> 6;
        uVar14 = 1L << (uVar14 & 0x3f);
        if ((uVar17 & 1) == 0) {
          uVar15 = ~uVar14 & puVar2[uVar18];
        }
        else {
          uVar15 = uVar14 | puVar2[uVar18];
        }
        puVar2[uVar18] = uVar15;
        lVar11 = lVar11 + 1;
      }
      iVar9 = iVar9 + (int)lVar11;
    }
    else {
      *(undefined4 *)((long)pvVar6 + uVar17 * 4) = 0xffffffff;
      lVar11 = 0;
    }
    *(int *)((long)pvVar7 + uVar17 * 4) = (int)lVar11;
  }
  this->iterations = 1;
  do {
    iVar9 = 0;
    do {
      while( true ) {
        if (iVar10 < iVar9) {
          for (uVar14 = 0; (long)uVar14 < ((this->super_Solver).game)->n_vertices;
              uVar14 = uVar14 + 1) {
            uVar18 = uVar14 >> 6;
            if ((((this->super_Solver).disabled)->_bits[uVar18] >> (uVar14 & 0x3f) & 1) == 0) {
              uVar17 = 1L << (uVar14 & 0x3f);
              winner = (uint)((((this->distraction)._bits[uVar18] & uVar17) != 0) !=
                             (((this->parity)._bits[uVar18] & uVar17) != 0));
              uVar4 = Solver::owner(&this->super_Solver,(int)uVar14);
              iVar10 = -1;
              if (uVar4 == winner) {
                iVar10 = this->strategy[uVar14];
              }
              Solver::solve(&this->super_Solver,(int)uVar14,winner,iVar10);
            }
          }
          if (this->strategy != (int *)0x0) {
            operator_delete__(this->strategy);
          }
          if (this->frozen != (int *)0x0) {
            operator_delete__(this->frozen);
          }
          operator_delete__(pvVar6);
          operator_delete__(pvVar7);
          poVar8 = std::operator<<((this->super_Solver).logger,"solved with ");
          poVar8 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar8);
          poVar8 = std::operator<<(poVar8," iterations.");
          std::endl<char,std::char_traits<char>>(poVar8);
          if ((this->super_Solver).trace != 0) {
            std::operator<<((this->super_Solver).logger,"Distractions:\n");
            for (uVar14 = 0; (long)uVar14 < ((this->super_Solver).game)->n_vertices;
                uVar14 = uVar14 + 1) {
              if (((this->distraction)._bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
                pcVar13 = "\x1b[1;38:5:34m";
              }
              else {
                pcVar13 = "\x1b[1;38:5:124m";
              }
              poVar8 = std::operator<<((this->super_Solver).logger,pcVar13);
              local_40.g = (this->super_Solver).game;
              local_40.v = (int)uVar14;
              poVar8 = operator<<(poVar8,&local_40);
              std::operator<<(poVar8,"\x1b[m");
              std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
            }
          }
          return;
        }
        iVar3 = *(int *)((long)pvVar7 + (long)iVar9 * 4);
        if (iVar3 != 0) break;
LAB_0014eb88:
        iVar9 = iVar9 + 1;
      }
      i = *(int *)((long)pvVar6 + (long)iVar9 * 4);
      iVar3 = updateBlock(this,i,iVar3);
      if (iVar3 == 0) goto LAB_0014eb88;
      if (iVar9 != 0) {
        freezeThawReset(this,0,i,iVar9);
      }
      this->iterations = this->iterations + 1;
      iVar9 = 0;
    } while ((this->super_Solver).trace < 2);
    poVar8 = std::operator<<((this->super_Solver).logger,"restarting after finding distractions");
    std::endl<char,std::char_traits<char>>(poVar8);
  } while( true );
}

Assistant:

void
FPISolver::runSeq()
{
    /**
     * Allocate and initialize data structures
     */
    distraction.resize(nodecount());
    strategy = new int[nodecount()]; // the current strategy for winning the game
    frozen = new int[nodecount()]; // records for every vertex at which level it is frozen (or 0 if not frozen)
    memset(frozen, 0, sizeof(int[nodecount()])); // initially no vertex is frozen (we don't freeze at level 0)

    int d = priority(nodecount()-1);
    int *p_start = new int[d+1];
    int *p_len = new int[d+1];
    parity.resize(nodecount());

    /**
     * Initialize p_start, p_len, parity
     */
    int v=0;
    for (int p=0; p<=d; p++) {
        if (priority(v) == p) {
            p_start[p] = v;
            while (v < nodecount() and priority(v) == p) {
                parity[v] = p&1;
                v++;
            }
            p_len[p] = v - p_start[p];
        } else {
            p_start[p] = -1;
            p_len[p] = 0;
        }
    }

    /**
     * The main loop
     */
    iterations = 1;
    int p = 0;
    while (p <= d) {
        if (p_len[p] == 0 or updateBlock(p_start[p], p_len[p]) == 0) {
            p++;
            continue;
        } 

        if (p != 0) {
            // actually we don't freeze at priority 0 :-)
            freezeThawReset(0, p_start[p] /* +p_len[p] */, p);
            p = 0;
        }

        iterations++;
#ifndef NDEBUG
        if (trace >= 2) logger << "restarting after finding distractions" << std::endl;
#endif
    }

    /**
     * Done, now tell Oink the solution
     */
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    /**
     * Free allocated data structures
     */
    delete[] strategy;
    delete[] frozen;
    delete[] p_start;
    delete[] p_len;

    logger << "solved with " << iterations << " iterations." << std::endl;

#ifndef NDEBUG
    if (trace) {
        logger << "Distractions:\n";
        for (int v=0; v<nodecount(); v++) {
            if (distraction[v]) logger << "\033[1;38:5:124m" << label_vertex(v) << "\033[m";
            else logger << "\033[1;38:5:34m" << label_vertex(v) << "\033[m";
            logger << std::endl;
        }
    }
#endif
}